

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O1

void __thiscall
GdlBinaryExpression::FixFeatureTestsInRules(GdlBinaryExpression *this,GrcFont *pfont)

{
  uint uVar1;
  GdlExpression *pGVar2;
  pointer pcVar3;
  uint __val;
  uint uVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  GdlFeatureDefn *this_00;
  undefined4 extraout_var;
  GdlExpression *pGVar8;
  GdlFeatureSetting *pGVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  uint __len;
  bool fErr;
  string __str;
  undefined1 local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  undefined4 extraout_var_00;
  
  if (this->m_pexpOperand1 == (GdlExpression *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar7 = __dynamic_cast(this->m_pexpOperand1,&GdlExpression::typeinfo,
                           &GdlLookupExpression::typeinfo,0);
  }
  bVar5 = GrcSymbolTableEntry::IsComparativeOp(this->m_psymOperator);
  if (lVar7 != 0 && bVar5) {
    bVar5 = GrcSymbolTableEntry::FitsSymbolType
                      (*(GrcSymbolTableEntry **)(lVar7 + 0x38),ksymtFeature);
    if (bVar5) {
      this_00 = GrcSymbolTableEntry::FeatureDefnData(*(GrcSymbolTableEntry **)(lVar7 + 0x38));
      iVar6 = (*this->m_pexpOperand2->_vptr_GdlExpression[0xd])
                        (this->m_pexpOperand2,this_00,&local_d1);
      pGVar8 = this->m_pexpOperand2;
      if ((GdlExpression *)CONCAT44(extraout_var,iVar6) != pGVar8) {
        if (pGVar8 != (GdlExpression *)0x0) {
          (*pGVar8->_vptr_GdlExpression[2])();
        }
        this->m_pexpOperand2 = (GdlExpression *)CONCAT44(extraout_var,iVar6);
      }
      iVar6 = (*this->m_pexpOperand2->_vptr_GdlExpression[0x10])(this->m_pexpOperand2,0xffff,pfont);
      pGVar8 = (GdlExpression *)CONCAT44(extraout_var_00,iVar6);
      if ((pGVar8 != (GdlExpression *)0x0) && (pGVar2 = this->m_pexpOperand2, pGVar8 != pGVar2)) {
        if (pGVar2 != (GdlExpression *)0x0) {
          (*pGVar2->_vptr_GdlExpression[2])();
        }
        this->m_pexpOperand2 = pGVar8;
      }
      if (this->m_pexpOperand2 == (GdlExpression *)0x0) {
        lVar7 = 0;
      }
      else {
        lVar7 = __dynamic_cast(this->m_pexpOperand2,&GdlExpression::typeinfo,
                               &GdlNumericExpression::typeinfo,0);
      }
      if ((lVar7 != 0) && (this_00->m_fStdLang == false)) {
        pGVar9 = GdlFeatureDefn::FindSettingWithValue(this_00,*(int *)(lVar7 + 0x34));
        if (pGVar9 == (GdlFeatureSetting *)0x0) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Feature \'","");
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          pcVar3 = (this_00->m_staName)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar3,pcVar3 + (this_00->m_staName)._M_string_length);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"\' has no setting with value ","");
          uVar1 = *(uint *)(lVar7 + 0x34);
          __val = -uVar1;
          if (0 < (int)uVar1) {
            __val = uVar1;
          }
          __len = 1;
          if (9 < __val) {
            uVar11 = (ulong)__val;
            uVar4 = 4;
            do {
              __len = uVar4;
              uVar10 = (uint)uVar11;
              if (uVar10 < 100) {
                __len = __len - 2;
                goto LAB_0014f2e2;
              }
              if (uVar10 < 1000) {
                __len = __len - 1;
                goto LAB_0014f2e2;
              }
              if (uVar10 < 10000) goto LAB_0014f2e2;
              uVar11 = uVar11 / 10000;
              uVar4 = __len + 4;
            } while (99999 < uVar10);
            __len = __len + 1;
          }
LAB_0014f2e2:
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_d0,(char)__len - (char)((int)uVar1 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_d0._M_dataplus._M_p + (uVar1 >> 0x1f),__len,__val);
          bVar5 = -1 < *(int *)(lVar7 + 0x38);
          pcVar12 = "";
          if (bVar5) {
            pcVar12 = "m";
          }
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,pcVar12,pcVar12 + bVar5);
          GrcErrorList::AddItem
                    (&g_errorList,false,0x9d2,&(this->super_GdlExpression).super_GdlObject,
                     (GrpLineAndFile *)0x0,&local_70,&local_90,&local_b0,&local_d0,&local_50,
                     (string *)0x0,(string *)0x0,(string *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
      }
      return;
    }
  }
  (*this->m_pexpOperand1->_vptr_GdlExpression[0xc])(this->m_pexpOperand1,pfont);
  (*this->m_pexpOperand2->_vptr_GdlExpression[0xc])(this->m_pexpOperand2,pfont);
  return;
}

Assistant:

void GdlBinaryExpression::FixFeatureTestsInRules(GrcFont *pfont)
{

	GdlLookupExpression * pexplookFeature =
		dynamic_cast<GdlLookupExpression *>(m_pexpOperand1);

	if (m_psymOperator->IsComparativeOp() && pexplookFeature &&
		pexplookFeature->NameFitsSymbolType(ksymtFeature))
	{
		GdlFeatureDefn * pfeat = pexplookFeature->Name()->FeatureDefnData();
		Assert(pfeat);
		bool fErr;
		GdlExpression * pexpNew = m_pexpOperand2->ConvertFeatureSettingValue(pfeat, fErr);
		if (pexpNew != m_pexpOperand2)
		{
			delete m_pexpOperand2;
			m_pexpOperand2 = pexpNew;
		}

		pexpNew = m_pexpOperand2->SimplifyAndUnscale(0xFFFF, pfont);
		Assert(pexpNew);
		if (pexpNew && pexpNew != m_pexpOperand2)
		{
			delete m_pexpOperand2;
			m_pexpOperand2 = pexpNew;
		}

		GdlNumericExpression * pexpnum = dynamic_cast<GdlNumericExpression *>(m_pexpOperand2);
		if (pexpnum)
		{
			if (!pfeat->IsLanguageFeature())
			{
				GdlFeatureSetting * pfset = pfeat->FindSettingWithValue(pexpnum->Value());
				if (!pfset)
				{
					g_errorList.AddWarning(2514, this,
						"Feature '",
						pfeat->Name(),
						"' has no setting with value ",
						std::to_string(pexpnum->Value()),
						((pexpnum->m_munits >= kmunitDefault) ? "m" : ""));
				}
			}
		}
	}
	else
	{
		m_pexpOperand1->FixFeatureTestsInRules(pfont);
		m_pexpOperand2->FixFeatureTestsInRules(pfont);
	}
}